

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFile
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  size_type *psVar1;
  undefined8 *puVar2;
  GeneratorOptions *pGVar3;
  GeneratorOptions *pGVar4;
  char cVar5;
  string *filename;
  Printer *printer_00;
  FileDescriptor *pFVar6;
  long lVar7;
  undefined8 *puVar8;
  long *plVar9;
  _Rb_tree_node_base *p_Var10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  GeneratorOptions *pGVar14;
  undefined8 uVar15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  int iVar18;
  long lVar19;
  FileToc *pFVar20;
  bool bVar21;
  string result;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files;
  set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  FileDescriptor *local_110;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Rb_tree_node_base *local_c0;
  Printer *local_b8;
  undefined1 local_b0 [32];
  _Rb_tree_node_base *local_90;
  size_t local_88;
  string local_80;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  local_110 = file;
  io::Printer::Print(printer,
                     "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                    );
  local_c0 = (_Rb_tree_node_base *)this;
  local_b8 = printer;
  if (options->import_style == kImportCommonJs) {
    io::Printer::Print(printer,"var jspb = require(\'google-protobuf\');\n");
    io::Printer::Print(printer,"var goog = jspb;\n");
    io::Printer::Print(printer,"var global = Function(\'return this\')();\n\n");
    if (0 < *(int *)(file + 0x18)) {
      iVar18 = 0;
      do {
        pFVar6 = FileDescriptor::dependency(file,iVar18);
        filename = *(string **)pFVar6;
        anon_unknown_0::ModuleAlias((string *)local_60,filename);
        plVar9 = *(long **)local_110;
        lVar7 = std::__cxx11::string::find((char *)filename,0x356e30,0);
        if (lVar7 == 0) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          local_108._0_8_ = (GeneratorOptions *)0x10;
          local_130._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)local_108);
          local_130.field_2._M_allocated_capacity = local_108._0_8_;
          *(undefined8 *)local_130._M_dataplus._M_p = 0x702d656c676f6f67;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 8) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 9) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 10) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xb) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xc) = 'b';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xd) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xe) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xf) = '/';
          local_130._M_string_length = local_108._0_8_;
          local_130._M_dataplus._M_p[local_108._0_8_] = '\0';
        }
        else {
          lVar7 = plVar9[1];
          if (lVar7 != 0) {
            lVar12 = 0;
            lVar13 = 0;
            do {
              lVar19 = lVar13;
              cVar5 = *(char *)(*plVar9 + lVar12);
              lVar13 = (ulong)(cVar5 == '/') + lVar19;
              lVar12 = lVar12 + 1;
            } while (lVar7 != lVar12);
            if (lVar13 != 0) {
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              local_130._M_string_length = 0;
              local_130.field_2._M_allocated_capacity =
                   local_130.field_2._M_allocated_capacity & 0xffffffffffffff00;
              lVar19 = lVar19 + (ulong)(cVar5 == '/');
              do {
                std::__cxx11::string::append((char *)&local_130);
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
              goto LAB_0022787f;
            }
          }
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          local_130._M_string_length = 2;
          local_130.field_2._M_allocated_capacity._0_3_ = 0x2f2e;
        }
LAB_0022787f:
        anon_unknown_0::GetJSFilename((string *)local_108,options,filename);
        uVar15 = (GeneratorOptions *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          uVar15 = local_130.field_2._M_allocated_capacity;
        }
        pGVar4 = (GeneratorOptions *)
                 ((long)&(((string *)local_130._M_string_length)->_M_dataplus)._M_p +
                 (long)&(((string *)local_108._8_8_)->_M_dataplus)._M_p);
        if ((ulong)uVar15 < pGVar4) {
          pGVar14 = (GeneratorOptions *)0xf;
          if ((GeneratorOptions *)local_108._0_8_ != (GeneratorOptions *)(local_108 + 0x10)) {
            pGVar14 = (GeneratorOptions *)local_108._16_8_;
          }
          if (pGVar14 < pGVar4) goto LAB_002278d9;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)local_108,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
        }
        else {
LAB_002278d9:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,local_108._0_8_)
          ;
        }
        local_b0._0_8_ = local_b0 + 0x10;
        psVar1 = puVar8 + 2;
        if ((size_type *)*puVar8 == psVar1) {
          local_b0._16_8_ = *psVar1;
          local_b0._24_8_ = puVar8[3];
        }
        else {
          local_b0._16_8_ = *psVar1;
          local_b0._0_8_ = (size_type *)*puVar8;
        }
        local_b0._8_8_ = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        io::Printer::Print(local_b8,"var $alias$ = require(\'$file$\');\n","alias",
                           (string *)local_60,"file",(string *)local_b0);
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        if ((GeneratorOptions *)local_108._0_8_ != (GeneratorOptions *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
        iVar18 = iVar18 + 1;
        file = local_110;
      } while (iVar18 < *(int *)(local_110 + 0x18));
    }
  }
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = 0;
  local_38 = 0;
  local_b0._24_8_ = local_b0 + 8;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffff00000000;
  local_b0._16_8_ = 0;
  local_88 = 0;
  pGVar4 = (GeneratorOptions *)(local_108 + 0x10);
  local_90 = (_Rb_tree_node_base *)local_b0._24_8_;
  local_40 = (_Base_ptr)local_60._24_8_;
  if (0 < *(int *)(file + 0x88)) {
    lVar7 = 0;
    lVar13 = 0;
    do {
      if (((options->import_style != kImportClosure) ||
          (*(char *)(*(long *)(file + 0x98) + 0x50 + lVar7) != '\x01')) ||
         (iVar18 = std::__cxx11::string::compare
                             ((char *)**(undefined8 **)
                                        (*(long *)(*(long *)(file + 0x98) + 0x58 + lVar7) + 0x10)),
         file = local_110, iVar18 != 0)) {
        (anonymous_namespace)::GetFilePath_abi_cxx11_
                  (&local_80,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                   (GeneratorOptions *)(options->namespace_prefix)._M_string_length,file);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_80);
        pGVar14 = (GeneratorOptions *)(plVar9 + 2);
        if ((GeneratorOptions *)*plVar9 == pGVar14) {
          local_108._16_8_ = (pGVar14->output_dir)._M_dataplus._M_p;
          local_108._24_8_ = plVar9[3];
          local_108._0_8_ = pGVar4;
        }
        else {
          local_108._16_8_ = (pGVar14->output_dir)._M_dataplus._M_p;
          local_108._0_8_ = (GeneratorOptions *)*plVar9;
        }
        local_108._8_8_ = plVar9[1];
        *plVar9 = (long)pGVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                  ((string *)&local_e8,
                   (_anonymous_namespace_ *)(*(long *)(local_110 + 0x98) + lVar7),
                   (GeneratorOptions *)local_108._8_8_,(FieldDescriptor *)pGVar14);
        pGVar14 = (GeneratorOptions *)0xf;
        if ((GeneratorOptions *)local_108._0_8_ != pGVar4) {
          pGVar14 = (GeneratorOptions *)local_108._16_8_;
        }
        pGVar3 = (GeneratorOptions *)
                 ((long)&(((string *)local_108._8_8_)->_M_dataplus)._M_p + local_e8._8_8_);
        if (pGVar14 < pGVar3) {
          uVar15 = (GeneratorOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_allocated_capacity != &local_d8) {
            uVar15 = local_d8._M_allocated_capacity;
          }
          if ((ulong)uVar15 < pGVar3) goto LAB_00227b60;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,local_108._0_8_);
        }
        else {
LAB_00227b60:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_108,local_e8._M_allocated_capacity);
        }
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        puVar2 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar2) {
          local_130.field_2._M_allocated_capacity = *puVar2;
          local_130.field_2._8_8_ = puVar8[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *puVar2;
          local_130._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_130._M_string_length = puVar8[1];
        *puVar8 = puVar2;
        puVar8[1] = 0;
        *(undefined1 *)puVar2 = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_60,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_allocated_capacity != &local_d8) {
          operator_delete((void *)local_e8._M_allocated_capacity,
                          (ulong)(local_d8._M_allocated_capacity + 1));
        }
        if ((GeneratorOptions *)local_108._0_8_ != pGVar4) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        local_130._M_dataplus._M_p = (pointer)(*(long *)(local_110 + 0x98) + lVar7);
        std::
        _Rb_tree<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*,std::_Identity<google::protobuf::FieldDescriptor_const*>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_insert_unique<google::protobuf::FieldDescriptor_const*>
                  ((_Rb_tree<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*,std::_Identity<google::protobuf::FieldDescriptor_const*>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)local_b0,(FieldDescriptor **)&local_130);
      }
      lVar13 = lVar13 + 1;
      lVar7 = lVar7 + 0xa8;
      file = local_110;
    } while (lVar13 < *(int *)(local_110 + 0x88));
  }
  printer_00 = local_b8;
  p_Var16 = local_c0;
  FindProvidesForFile((Generator *)local_c0,options,local_b8,file,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_60);
  GenerateProvides((Generator *)p_Var16,options,printer_00,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ = 0;
  local_d8._M_allocated_capacity = 0;
  std::
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
            ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)local_e8._M_local_buf,(iterator)0x0,&local_110);
  if (options->import_style == kImportClosure) {
    GenerateRequiresForLibrary
              ((Generator *)local_c0,options,printer_00,
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&local_e8,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
  }
  p_Var16 = local_c0;
  GenerateClassesAndEnums((Generator *)local_c0,options,printer_00,local_110);
  p_Var17 = (_Rb_tree_node_base *)local_b0._24_8_;
  while (p_Var17 != (_Rb_tree_node_base *)(local_b0 + 8)) {
    GenerateExtension((Generator *)p_Var16,options,printer_00,*(FieldDescriptor **)(p_Var17 + 1));
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    p_Var16 = p_Var17;
    p_Var17 = p_Var10;
  }
  if (options->import_style == kImportCommonJs) {
    (anonymous_namespace)::GetFilePath_abi_cxx11_
              (&local_130,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,local_110);
    io::Printer::Print(printer_00,"goog.object.extend(exports, $package$);\n","package",&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
  }
  if (well_known_types_js[0].name != (char *)0x0) {
    pFVar20 = well_known_types_js;
    do {
      pFVar20 = pFVar20 + 1;
      local_108._0_8_ = pGVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"google/protobuf/","");
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)local_108);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      pcVar11 = (char *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar11) {
        local_130.field_2._M_allocated_capacity = *(undefined8 *)pcVar11;
        local_130.field_2._8_8_ = puVar8[3];
      }
      else {
        local_130.field_2._M_allocated_capacity = *(undefined8 *)pcVar11;
        local_130._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_130._M_string_length = puVar8[1];
      *puVar8 = pcVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if ((GeneratorOptions *)local_108._0_8_ != pGVar4) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      anon_unknown_0::StripProto(&local_80,*(string **)local_110);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
      pGVar14 = (GeneratorOptions *)(puVar8 + 2);
      if ((GeneratorOptions *)*puVar8 == pGVar14) {
        local_108._16_8_ = (pGVar14->output_dir)._M_dataplus._M_p;
        local_108._24_8_ = puVar8[3];
        local_108._0_8_ = pGVar4;
      }
      else {
        local_108._16_8_ = (pGVar14->output_dir)._M_dataplus._M_p;
        local_108._0_8_ = (GeneratorOptions *)*puVar8;
      }
      uVar15 = local_108._0_8_;
      local_108._8_8_ = puVar8[1];
      *puVar8 = pGVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if (local_130._M_string_length == local_108._8_8_) {
        if ((GeneratorOptions *)local_130._M_string_length == (GeneratorOptions *)0x0) {
          bVar21 = true;
        }
        else {
          iVar18 = bcmp(local_130._M_dataplus._M_p,(void *)local_108._0_8_,
                        local_130._M_string_length);
          bVar21 = iVar18 == 0;
        }
      }
      else {
        bVar21 = false;
      }
      if ((GeneratorOptions *)uVar15 != pGVar4) {
        operator_delete((void *)uVar15,(ulong)(local_108._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (bVar21) {
        io::Printer::Print(local_b8,pFVar20[-1].data);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
      }
    } while (pFVar20->name != (char *)0x0);
  }
  if ((void *)local_e8._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_e8._M_allocated_capacity,
                    local_d8._M_allocated_capacity - local_e8._0_8_);
  }
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Rb_tree((_Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  return;
}

Assistant:

void Generator::GenerateFile(const GeneratorOptions& options,
                             io::Printer* printer,
                             const FileDescriptor* file) const {
  GenerateHeader(options, printer);

  // Generate "require" statements.
  if (options.import_style == GeneratorOptions::kImportCommonJs) {
    printer->Print("var jspb = require('google-protobuf');\n");
    printer->Print("var goog = jspb;\n");
    printer->Print("var global = Function('return this')();\n\n");

    for (int i = 0; i < file->dependency_count(); i++) {
      const string& name = file->dependency(i)->name();
      printer->Print(
          "var $alias$ = require('$file$');\n",
          "alias", ModuleAlias(name),
          "file", GetRootPath(file->name(), name) + GetJSFilename(options, name));
    }
  }

  std::set<string> provided;
  std::set<const FieldDescriptor*> extensions;
  for (int i = 0; i < file->extension_count(); i++) {
    // We honor the jspb::ignore option here only when working with
    // Closure-style imports. Use of this option is discouraged and so we want
    // to avoid adding new support for it.
    if (options.import_style == GeneratorOptions::kImportClosure &&
        IgnoreField(file->extension(i))) {
      continue;
    }
    provided.insert(GetFilePath(options, file) + "." +
                    JSObjectFieldName(options, file->extension(i)));
    extensions.insert(file->extension(i));
  }

  FindProvidesForFile(options, printer, file, &provided);
  GenerateProvides(options, printer, &provided);
  std::vector<const FileDescriptor*> files;
  files.push_back(file);
  if (options.import_style == GeneratorOptions::kImportClosure) {
    GenerateRequiresForLibrary(options, printer, files, &provided);
  }

  GenerateClassesAndEnums(options, printer, file);

  // Generate code for top-level extensions. Extensions nested inside messages
  // are emitted inside GenerateClassesAndEnums().
  for (std::set<const FieldDescriptor*>::const_iterator it = extensions.begin();
       it != extensions.end(); ++it) {
    GenerateExtension(options, printer, *it);
  }

  if (options.import_style == GeneratorOptions::kImportCommonJs) {
    printer->Print("goog.object.extend(exports, $package$);\n",
                   "package", GetFilePath(options, file));
  }

  // Emit well-known type methods.
  for (FileToc* toc = well_known_types_js; toc->name != NULL; toc++) {
    string name = string("google/protobuf/") + toc->name;
    if (name == StripProto(file->name()) + ".js") {
      printer->Print(toc->data);
    }
  }
}